

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.h
# Opt level: O0

void __thiscall
sentencepiece::SentencePieceText::set_text(SentencePieceText *this,char *value,size_t size)

{
  Arena *pAVar1;
  allocator local_59;
  string local_58 [40];
  size_t local_30;
  size_t size_local;
  char *value_local;
  SentencePieceText *this_local;
  HasBits<1UL> *local_10;
  
  local_10 = &this->_has_bits_;
  this_local._4_4_ = 0;
  local_10->has_bits_[0] = local_10->has_bits_[0] | 1;
  local_30 = size;
  size_local = (size_t)value;
  value_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,value,size,&local_59);
  pAVar1 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::Set(&this->text_,local_58,pAVar1);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return;
}

Assistant:

inline void SentencePieceText::set_text(const char* value,
    size_t size) {
  _has_bits_[0] |= 0x00000001u;
  text_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, ::std::string(
      reinterpret_cast<const char*>(value), size), GetArena());
  // @@protoc_insertion_point(field_set_pointer:sentencepiece.SentencePieceText.text)
}